

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  u16 uVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  u32 uVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  uint uVar9;
  ulong uVar10;
  
  iVar2 = sqlite3LookasideUsed(db,(int *)0x0);
  if (0 < iVar2) {
    return 5;
  }
  if ((db->lookaside).bMalloced != '\0') {
    sqlite3_free((db->lookaside).pStart);
  }
  uVar9 = sz & 0xfffffff8;
  uVar10 = (ulong)uVar9;
  uVar6 = uVar9;
  if ((int)uVar9 < 9) {
    uVar6 = 0;
  }
  uVar7 = (ulong)(uint)cnt;
  if (cnt < 1) {
    uVar7 = 0;
  }
  uVar5 = (u32)uVar7;
  uVar1 = 0;
  if (cnt < 1 || (int)uVar9 < 9) {
LAB_00129e18:
    (db->lookaside).pInit = (LookasideSlot *)0x0;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = uVar1;
    (db->lookaside).pStart = db;
    (db->lookaside).pEnd = db;
    (db->lookaside).bDisable = 1;
    (db->lookaside).bMalloced = '\0';
    (db->lookaside).nSlot = 0;
  }
  else {
    puVar3 = (undefined8 *)pBuf;
    if (pBuf == (void *)0x0) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      puVar3 = (undefined8 *)sqlite3Malloc(uVar7 * uVar10);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      uVar1 = (u16)uVar6;
      if (puVar3 == (undefined8 *)0x0) goto LAB_00129e18;
      iVar2 = (*sqlite3Config.m.xSize)(puVar3);
      uVar5 = iVar2 / (int)uVar9;
    }
    (db->lookaside).pStart = puVar3;
    (db->lookaside).pInit = (LookasideSlot *)0x0;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = (u16)uVar9;
    (db->lookaside).nSlot = uVar5;
    if (0 < (int)uVar5) {
      uVar6 = uVar5 + 1;
      puVar4 = (undefined8 *)0x0;
      puVar8 = puVar3;
      do {
        *puVar8 = puVar4;
        puVar3 = (undefined8 *)((long)puVar8 + uVar10);
        uVar6 = uVar6 - 1;
        puVar4 = puVar8;
        puVar8 = puVar3;
      } while (1 < uVar6);
      (db->lookaside).pInit = (LookasideSlot *)((long)puVar3 - uVar10);
    }
    (db->lookaside).pEnd = puVar3;
    (db->lookaside).bDisable = 0;
    (db->lookaside).bMalloced = pBuf == (void *)0x0;
  }
  return 0;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  
  if( sqlite3LookasideUsed(db,0)>0 ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for 
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( sz*(sqlite3_int64)cnt );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) cnt = sqlite3MallocSize(pStart)/sz;
  }else{
    pStart = pBuf;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pInit = 0;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    db->lookaside.nSlot = cnt;
    p = (LookasideSlot*)pStart;
    for(i=cnt-1; i>=0; i--){
      p->pNext = db->lookaside.pInit;
      db->lookaside.pInit = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
  }else{
    db->lookaside.pStart = db;
    db->lookaside.pEnd = db;
    db->lookaside.bDisable = 1;
    db->lookaside.bMalloced = 0;
    db->lookaside.nSlot = 0;
  }
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}